

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Parser * __thiscall Parser::get_animal_abi_cxx11_(Parser *this)

{
  long in_RSI;
  Parser *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x90));
  return this;
}

Assistant:

string Parser::get_animal() {
    return animal;
}